

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O1

_Bool reset_hash_node(hashtable *table,void *label)

{
  hashnode *__ptr;
  _Bool _Var1;
  uint uVar2;
  hashnode *phVar3;
  
  uVar2 = (*table->hash)(label);
  __ptr = table->nodes + (ulong)uVar2 % (ulong)(uint)table->size;
  do {
    phVar3 = __ptr;
    __ptr = phVar3->next;
    if (__ptr == (hashnode *)0x0) goto LAB_001029b9;
    _Var1 = (*table->compare)(__ptr->record,label);
  } while (!_Var1);
  phVar3->next = __ptr->next;
  free(__ptr);
LAB_001029b9:
  return __ptr != (hashnode *)0x0;
}

Assistant:

bool reset_hash_node(hashtable* table,void *label){
  // #if DEBUG == 1
  
  // #endif
  unsigned pos = table->hash(label) % table->size;
  hashnode *node, *last;
  node = &table->nodes[pos];
  while (node->next) {
    last = node;
    node = node->next;
    if (table->compare(node->record,label)) {
      last->next = node->next;
      free(node);
      return 1;
    }
  }
  return 0;
}